

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O3

void __thiscall
Lib::Exception::Exception<char_const*,std::__cxx11::string,char_const*,unsigned_int,char_const*>
          (Exception *this,char *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *msg_1,char *msg_2,
          uint msg_3,char *msg_4)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar1 = (msg_1->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + msg_1->_M_string_length);
  toString<char_const*,std::__cxx11::string,char_const*,unsigned_int,char_const*>
            (&local_50,this,msg,&local_70,msg_2,msg_3,msg_4);
  this->_vptr_Exception = (_func_int **)&PTR_cry_00b3dfc0;
  (this->_message)._M_dataplus._M_p = (pointer)&(this->_message).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_message,local_50._M_dataplus._M_p,
             local_50._M_dataplus._M_p + local_50._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

explicit Exception(Msg... msg)
   : Exception(toString(msg...))
  { }